

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.c
# Opt level: O2

void file_add(char *name)

{
  char *pcVar1;
  file_entry_s *pfVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  char cVar6;
  filetype_t fVar7;
  
  pfVar2 = (file_entry_s *)mmalloc(0x18);
  pfVar2->next = (file_entry_s *)0x0;
  cur->next = pfVar2;
  cur = pfVar2;
  sVar3 = strlen(name);
  pcVar4 = (char *)mmalloc(sVar3 + 1);
  (pfVar2->file).name = pcVar4;
  strcpy(pcVar4,name);
  pcVar4 = (pfVar2->file).name;
  lVar5 = 0;
  do {
    pcVar1 = pcVar4 + lVar5;
    lVar5 = lVar5 + 1;
  } while (*pcVar1 != '\0');
  cVar6 = '\0';
  for (; (cVar6 != '.' && (lVar5 != 1)); lVar5 = lVar5 + -1) {
    cVar6 = pcVar4[lVar5 + -2];
  }
  if (cVar6 == '.') {
    if (((pcVar4[lVar5] == 'c') && (pcVar4[lVar5 + 1] == '\0')) ||
       ((pcVar4[lVar5] == 'C' && (pcVar4[lVar5 + 1] == '\0')))) {
      fVar7 = C;
      goto LAB_00108f9d;
    }
    fVar7 = I;
    if (((pcVar4[lVar5] == 'i') && (pcVar4[lVar5 + 1] == '\0')) ||
       ((pcVar4[lVar5] == 'I' && (pcVar4[lVar5 + 1] == '\0')))) goto LAB_00108f9d;
    fVar7 = S;
    if (((pcVar4[lVar5] == 's') && (pcVar4[lVar5 + 1] == '\0')) ||
       ((pcVar4[lVar5] == 'S' && (pcVar4[lVar5 + 1] == '\0')))) goto LAB_00108f9d;
  }
  fVar7 = O;
LAB_00108f9d:
  (pfVar2->file).type = fVar7;
  (pfVar2->file).tmp = 0;
  count = count + 1;
  return;
}

Assistant:

void file_add(const char* name)
{
    char* p;
    file_entry_t* nf = (file_entry_t*)mmalloc(sizeof(file_entry_t));
    nf->next = NULL;
    cur->next = nf;
    cur = cur->next;


    nf->file.name = (char*)mmalloc(strlen(name) + 1);
    strcpy(nf->file.name, name);
    p = nf->file.name;

    /* Find the file's type using its extension */
    while (*p)
        ++p;
    while (*p != '.' && p != nf->file.name)
        --p;

    if (strcmp(p, ".c") == 0 || strcmp(p, ".C") == 0)
        nf->file.type = C;
    else if (strcmp(p, ".i") == 0 || strcmp(p, ".I") == 0)
        nf->file.type = I;
    else if (strcmp(p, ".s") == 0 || strcmp(p, ".S") == 0)
        nf->file.type = S;
    else
        nf->file.type = O;

    nf->file.tmp = 0;
    ++count;
}